

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

int class_attributes_destroy_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  if (val != (set_value)0x0) {
    attribute_destroy((attribute_conflict)val);
  }
  return 0;
}

Assistant:

int class_attributes_destroy_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	(void)s;
	(void)key;
	(void)args;

	if (val != NULL)
	{
		attribute attr = val;

		attribute_destroy(attr);
	}

	return 0;
}